

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

char ** tbx_seqnames(tbx_t *tbx,int *n)

{
  char **ppcVar1;
  uint uVar2;
  uint *puVar3;
  char **ppcVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  
  puVar3 = (uint *)tbx->dict;
  if (puVar3 == (uint *)0x0) {
    uVar9 = 0;
    ppcVar4 = (char **)0x0;
  }
  else {
    uVar9 = puVar3[1];
    ppcVar4 = (char **)calloc((long)(int)uVar9,8);
    uVar2 = *puVar3;
    bVar7 = 0;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      if ((*(uint *)(*(long *)(puVar3 + 4) + (uVar8 >> 4 & 0xfffffff) * 4) >> (bVar7 & 0x1e) & 3) ==
          0) {
        iVar5 = (int)*(undefined8 *)(*(long *)(puVar3 + 8) + uVar8 * 8);
        if ((int)uVar9 <= iVar5) {
          __assert_fail("tid<m",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/tbx.c"
                        ,0x137,"const char **tbx_seqnames(tbx_t *, int *)");
        }
        ppcVar4[iVar5] = *(char **)(*(long *)(puVar3 + 6) + uVar8 * 8);
      }
      bVar7 = bVar7 + 2;
    }
    uVar8 = 0;
    uVar6 = 0;
    if (0 < (int)uVar9) {
      uVar6 = (ulong)uVar9;
    }
    while (uVar6 != uVar8) {
      ppcVar1 = ppcVar4 + uVar8;
      uVar8 = uVar8 + 1;
      if (*ppcVar1 == (char *)0x0) {
        __assert_fail("names[tid]",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/tbx.c"
                      ,0x13c,"const char **tbx_seqnames(tbx_t *, int *)");
      }
    }
  }
  *n = uVar9;
  return ppcVar4;
}

Assistant:

const char **tbx_seqnames(tbx_t *tbx, int *n)
{
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;
    if (d == NULL)
    {
        *n = 0;
        return NULL;
    }
    int tid, m = kh_size(d);
    const char **names = (const char**) calloc(m,sizeof(const char*));
    khint_t k;
    for (k=kh_begin(d); k<kh_end(d); k++)
    {
        if ( !kh_exist(d,k) ) continue;
        tid = kh_val(d,k);
        assert( tid<m );
        names[tid] = kh_key(d,k);
    }
    // sanity check: there should be no gaps
    for (tid=0; tid<m; tid++)
        assert(names[tid]);
    *n = m;
    return names;
}